

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_fifo.c
# Opt level: O1

int mk_fifo_destroy(mk_fifo *ctx)

{
  mk_list *pmVar1;
  mk_list *pmVar2;
  mk_list *pmVar3;
  mk_list *pmVar4;
  mk_list *__mptr_1;
  
  pmVar4 = (ctx->queues).next;
  while (pmVar4 != &ctx->queues) {
    pmVar1 = pmVar4->prev;
    pmVar2 = pmVar4->next;
    pmVar1->next = pmVar2;
    pmVar2->prev = pmVar1;
    pmVar4->prev = (mk_list *)0x0;
    pmVar4->next = (mk_list *)0x0;
    free(&pmVar4[-2].next);
    pmVar4 = pmVar2;
  }
  pmVar4 = (ctx->workers).next;
  while (pmVar4 != &ctx->workers) {
    pmVar1 = pmVar4->next;
    close(*(int *)((long)&pmVar4[-4].next + 4));
    close(*(int *)&pmVar4[-3].prev);
    pmVar2 = pmVar4->prev;
    pmVar3 = pmVar4->next;
    pmVar2->next = pmVar3;
    pmVar3->prev = pmVar2;
    pmVar4->prev = (mk_list *)0x0;
    pmVar4->next = (mk_list *)0x0;
    free(pmVar4[-2].prev);
    free(pmVar4 + -8);
    pmVar4 = pmVar1;
  }
  free(ctx);
  return 0;
}

Assistant:

int mk_fifo_destroy(struct mk_fifo *ctx)
{
    mk_fifo_queue_destroy_all(ctx);
    mk_fifo_worker_destroy_all(ctx);
    mk_mem_free(ctx);
    return 0;
}